

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O3

void __thiscall
HSimplexNla::reportPackValue(HSimplexNla *this,string *message,HVector *vector,bool force)

{
  HighsInt vecDim;
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  ulong uVar4;
  int log;
  int iVar5;
  vector<int,_std::allocator<int>_> sorted_index;
  vector<int,_std::allocator<int>_> local_80;
  string local_68;
  string local_48;
  
  if ((force | this->report_) == 1) {
    if (vector->packCount < 0x1a) {
      iVar5 = 0;
      printf("%s",(message->_M_dataplus)._M_p);
      std::vector<int,_std::allocator<int>_>::vector(&local_80,&vector->packIndex);
      uVar4 = (ulong)vector->packCount;
      if (uVar4 != 0) {
        lVar3 = uVar4 * 4;
        if (vector->packCount != 1) {
          iVar5 = 0;
          do {
            uVar4 = (long)uVar4 >> 1;
            iVar5 = iVar5 + 1;
          } while (1 < uVar4);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
                  (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (undefined1 *)
                   ((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar3),iVar5,1);
        if (0 < vector->packCount) {
          uVar4 = 0;
          do {
            uVar1 = *(uint *)((long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + uVar4 * 4);
            if ((int)uVar4 == (int)((uVar4 & 0xffffffff) / 5) * 5) {
              putchar(10);
            }
            printf("[%4d %11.4g] ",
                   (vector->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4],(ulong)uVar1);
            uVar4 = uVar4 + 1;
          } while ((long)uVar4 < (long)vector->packCount);
        }
      }
      putchar(10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return;
      }
    }
    else {
      pcVar2 = (message->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar2,pcVar2 + message->_M_string_length);
      vecDim = vector->packCount;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Unknown","");
      analyseVectorValues((HighsLogOptions *)0x0,&local_48,vecDim,&vector->packValue,true,&local_68)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_48._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p == &local_48.field_2) {
        return;
      }
    }
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void HSimplexNla::reportPackValue(const std::string message,
                                  const HVector* vector,
                                  const bool force) const {
  if (!report_ && !force) return;
  if (vector->packCount > kReportItemLimit) {
    analyseVectorValues(nullptr, message, vector->packCount, vector->packValue,
                        true);
    return;
  }
  printf("%s", message.c_str());
  std::vector<HighsInt> sorted_index = vector->packIndex;
  pdqsort(sorted_index.begin(), sorted_index.begin() + vector->packCount);
  for (HighsInt en = 0; en < vector->packCount; en++) {
    HighsInt iRow = sorted_index[en];
    if (en % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)iRow, vector->packValue[en]);
  }
  printf("\n");
}